

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scpserver.c
# Opt level: O1

void scp_sink_coroutine(ScpSink *scp)

{
  fxp_attrs *pfVar1;
  SftpReplyBuilder *pSVar2;
  char cVar3;
  strbuf *psVar4;
  SftpServer *pSVar5;
  uchar *puVar6;
  ptrlen pVar7;
  ptrlen pVar8;
  ptrlen pVar9;
  int iVar10;
  uint uVar11;
  ScpSinkStackEntry *pSVar12;
  void *pvVar13;
  ulonglong uVar14;
  char *pcVar15;
  size_t sVar16;
  size_t sVar17;
  SshChannelVtable *pSVar18;
  byte bVar19;
  int iVar20;
  unsigned_long uVar21;
  SshChannel *pSVar22;
  char *pcVar23;
  char *pcVar24;
  ulong len;
  ptrlen pVar25;
  unsigned_long dummy1;
  unsigned_long dummy2;
  void *local_78;
  uint64_t uStack_70;
  unsigned_long local_68;
  unsigned_long uStack_60;
  unsigned_long local_58;
  unsigned_long uStack_50;
  unsigned_long local_48;
  undefined1 local_38 [8];
  
  iVar10 = scp->crState;
  if (iVar10 < 0x4a3) {
    if (iVar10 == 0) goto LAB_001113eb;
    if (iVar10 == 0x439) goto LAB_00111417;
  }
  else {
    if (iVar10 == 0x4a3) goto LAB_00111829;
    if (iVar10 == 0x4c0) {
      do {
        if ((scp->input_eof == false) && (sVar16 = bufchain_size(&scp->data), sVar16 == 0)) {
          return;
        }
        if (scp->input_eof == true) {
LAB_001118f6:
          (*scp->sf->vt->close)(scp->sf,&(scp->reply).srb,(scp->reply).handle);
          goto LAB_00111914;
        }
        bufchain_consume(&scp->data,1);
LAB_001113eb:
        (*scp->sc->vt->write)(scp->sc,false,"",1);
        strbuf_shrink_to(scp->command,0);
        do {
          scp->crState = 0x439;
LAB_00111417:
          if ((scp->input_eof == false) && (sVar16 = bufchain_size(&scp->data), sVar16 == 0)) {
            return;
          }
          if (scp->input_eof != false) goto LAB_00111914;
          pVar25 = bufchain_prefix(&scp->data);
          pvVar13 = memchr(pVar25.ptr,10,pVar25.len);
          sVar16 = (long)(((int)pvVar13 - (int)pVar25.ptr) + 1);
          if (pvVar13 == (void *)0x0) {
            sVar16 = pVar25.len;
          }
          BinarySink_put_data(scp->command->binarysink_,pVar25.ptr,sVar16);
          bufchain_consume(&scp->data,sVar16);
        } while (pvVar13 == (void *)0x0);
        strbuf_chomp(scp->command,'\n');
        psVar4 = scp->command;
        bVar19 = 0;
        if (psVar4->len != 0) {
          bVar19 = *psVar4->s;
        }
        scp->command_chr = bVar19;
        if (1 < bVar19 - 0x43) {
          if (bVar19 == 0x45) {
            pSVar12 = scp->head;
            if (pSVar12 == (ScpSinkStackEntry *)0x0) {
              pcVar15 = dupstr("received E command without matching D");
              goto LAB_001117fa;
            }
            scp->head = pSVar12->next;
            safefree(pSVar12);
            scp->got_file_times = false;
            goto LAB_001113eb;
          }
          if (bVar19 == 0x54) {
            iVar10 = __isoc99_sscanf(psVar4->s,"T%lu %lu %lu %lu",&scp->mtime,&local_78,&scp->atime,
                                     local_38);
            iVar20 = 0xc;
            if (iVar10 == 4) {
              scp->got_file_times = true;
              iVar20 = 0;
            }
            if (iVar20 != 0) {
              if (iVar20 != 0xc) {
                return;
              }
              goto LAB_001117a3;
            }
            goto LAB_001113eb;
          }
LAB_001117a3:
          puVar6 = scp->command->u;
          uVar11 = string_length_for_printf(scp->command->len);
          pcVar15 = dupprintf("unrecognised scp command \'%.*s\'",(ulong)uVar11,puVar6);
          goto LAB_001117fa;
        }
        pcVar15 = psVar4->s;
        pfVar1 = &scp->attrs;
        (scp->attrs).flags = 4;
        (scp->attrs).permissions = 0;
        bVar19 = pcVar15[1];
        if ((bVar19 & 0xf8) == 0x30) {
          uVar21 = 0;
          do {
            uVar21 = (ulong)(byte)(bVar19 - 0x30) + uVar21 * 8;
            (scp->attrs).permissions = uVar21;
            bVar19 = pcVar15[2];
            pcVar15 = pcVar15 + 1;
          } while ((bVar19 & 0xf8) == 0x30);
        }
        if (bVar19 != 0x20) goto LAB_001117a3;
        pcVar15 = pcVar15 + 2;
        pcVar23 = pcVar15;
        pcVar24 = pcVar15;
        do {
          cVar3 = *pcVar24;
          pcVar24 = pcVar24 + 1;
          pcVar23 = pcVar23 + 1;
        } while ((byte)(cVar3 - 0x30U) < 10);
        if (cVar3 != ' ') goto LAB_001117a3;
        uVar14 = strtoull(pcVar15,(char **)0x0,10);
        scp->file_size = uVar14;
        sVar16 = scp->command->len;
        pcVar15 = scp->command->s;
        strbuf_shrink_to(scp->filename_sb,0);
        BinarySink_put_datapl(scp->filename_sb->binarysink_,scp->head->destpath);
        if (scp->head->isdir == true) {
          psVar4 = scp->filename_sb;
          if ((psVar4->len != 0) && (psVar4->s[psVar4->len - 1] != '/')) {
            BinarySink_put_byte(psVar4->binarysink_,'/');
          }
          pVar25.len = (size_t)(pcVar15 + (sVar16 - (long)pcVar23));
          pVar25.ptr = pcVar24;
          BinarySink_put_datapl(scp->filename_sb->binarysink_,pVar25);
        }
        psVar4 = scp->filename_sb;
        sVar16 = psVar4->len;
        pVar8.ptr = psVar4->u;
        pVar8.len = psVar4->len;
        pVar7.ptr = psVar4->u;
        pVar7.len = psVar4->len;
        (scp->filename).ptr = psVar4->u;
        (scp->filename).len = sVar16;
        if (scp->got_file_times == true) {
          uVar21 = scp->mtime;
          (scp->attrs).atime = scp->atime;
          (scp->attrs).mtime = uVar21;
          *(byte *)&(scp->attrs).flags = (byte)(scp->attrs).flags | 8;
        }
        scp->got_file_times = false;
        pSVar2 = &(scp->reply).srb;
        pSVar5 = scp->sf;
        if (scp->command_chr == 'D') {
          local_48 = (scp->attrs).mtime;
          local_78 = (void *)pfVar1->flags;
          uStack_70 = (scp->attrs).size;
          local_68 = (scp->attrs).uid;
          uStack_60 = (scp->attrs).gid;
          local_58 = (scp->attrs).permissions;
          uStack_50 = (scp->attrs).atime;
          (*pSVar5->vt->mkdir)(pSVar5,pSVar2,pVar7,*pfVar1);
          if ((scp->reply).err == true) {
            uVar11 = string_length_for_printf((scp->filename).len);
            pvVar13 = (scp->filename).ptr;
            pcVar15 = (scp->reply).errmsg;
            pcVar23 = "\'%.*s\': unable to create directory: %s";
            goto LAB_00111806;
          }
          pvVar13 = (scp->filename).ptr;
          sVar16 = (scp->filename).len;
          pSVar12 = (ScpSinkStackEntry *)safemalloc(1,0x20,sVar16);
          (pSVar12->destpath).ptr = pSVar12 + 1;
          (pSVar12->destpath).len = sVar16;
          memcpy(pSVar12 + 1,pvVar13,sVar16);
          pSVar12->isdir = true;
          pSVar12->next = scp->head;
          scp->head = pSVar12;
          goto LAB_001113eb;
        }
        local_48 = (scp->attrs).mtime;
        local_78 = (void *)pfVar1->flags;
        uStack_70 = (scp->attrs).size;
        local_68 = (scp->attrs).uid;
        uStack_60 = (scp->attrs).gid;
        local_58 = (scp->attrs).permissions;
        uStack_50 = (scp->attrs).atime;
        (*pSVar5->vt->open)(pSVar5,pSVar2,pVar8,0x1a,*pfVar1);
        if ((scp->reply).err == true) goto LAB_001117d7;
        (*scp->sc->vt->write)(scp->sc,false,"",1);
        scp->file_offset = 0;
        while (scp->file_offset < scp->file_size) {
          scp->crState = 0x4a3;
LAB_00111829:
          if ((scp->input_eof == false) && (sVar16 = bufchain_size(&scp->data), sVar16 == 0)) {
            return;
          }
          if (scp->input_eof == true) goto LAB_001118f6;
          pVar25 = bufchain_prefix(&scp->data);
          local_78 = pVar25.ptr;
          len = scp->file_size - scp->file_offset;
          if (pVar25.len < len) {
            len = pVar25.len;
          }
          pVar9.len = len;
          pVar9.ptr = local_78;
          uStack_70 = len;
          (*scp->sf->vt->write)
                    (scp->sf,&(scp->reply).srb,(scp->reply).handle,scp->file_offset,pVar9);
          if ((scp->reply).err == true) {
            uVar11 = string_length_for_printf((scp->filename).len);
            pvVar13 = (scp->filename).ptr;
            pcVar15 = (scp->reply).errmsg;
            pcVar23 = "\'%.*s\': unable to write to file: %s";
            goto LAB_00111806;
          }
          bufchain_consume(&scp->data,len);
          scp->file_offset = scp->file_offset + len;
        }
        scp->crState = 0x4c0;
      } while( true );
    }
    if (iVar10 == 0x4e8) goto LAB_00111993;
  }
  iVar10 = 0;
  goto LAB_00111993;
LAB_001117d7:
  uVar11 = string_length_for_printf((scp->filename).len);
  pvVar13 = (scp->filename).ptr;
  pcVar15 = (scp->reply).errmsg;
  pcVar23 = "\'%.*s\': unable to open file: %s";
LAB_00111806:
  pcVar15 = dupprintf(pcVar23,(ulong)uVar11,pvVar13,pcVar15);
LAB_001117fa:
  scp->errmsg = pcVar15;
LAB_00111914:
  pSVar22 = scp->sc;
  pcVar15 = scp->errmsg;
  if (pcVar15 == (char *)0x0) {
    pSVar18 = pSVar22->vt;
  }
  else {
    sVar17 = strlen(pcVar15);
    (*pSVar22->vt->write)(pSVar22,true,pcVar15,sVar17);
    (*scp->sc->vt->write)(scp->sc,true,"\n",1);
    pSVar22 = scp->sc;
    pSVar18 = pSVar22->vt;
  }
  (*pSVar18->send_exit_status)(pSVar22,(uint)(pcVar15 != (char *)0x0));
  (*scp->sc->vt->write_eof)(scp->sc);
  (*scp->sc->vt->initiate_close)(scp->sc,scp->errmsg);
  iVar10 = 0x4e8;
LAB_00111993:
  scp->crState = iVar10;
  return;
}

Assistant:

static void scp_sink_coroutine(ScpSink *scp)
{
    crBegin(scp->crState);

    while (1) {
        /*
         * Send an ack, and read a command.
         */
        sshfwd_write(scp->sc, "\0", 1);
        strbuf_clear(scp->command);
        while (1) {
            crMaybeWaitUntilV(scp->input_eof || bufchain_size(&scp->data) > 0);
            if (scp->input_eof)
                goto done;

            ptrlen data = bufchain_prefix(&scp->data);
            const char *cdata = data.ptr;
            const char *newline = memchr(cdata, '\012', data.len);
            if (newline)
                data.len = (int)(newline+1 - cdata);
            put_data(scp->command, cdata, data.len);
            bufchain_consume(&scp->data, data.len);

            if (newline)
                break;
        }

        /*
         * Parse the command.
         */
        strbuf_chomp(scp->command, '\n');
        scp->command_chr = scp->command->len > 0 ? scp->command->s[0] : '\0';
        if (scp->command_chr == 'T') {
            unsigned long dummy1, dummy2;
            if (sscanf(scp->command->s, "T%lu %lu %lu %lu",
                       &scp->mtime, &dummy1, &scp->atime, &dummy2) != 4)
                goto parse_error;
            scp->got_file_times = true;
        } else if (scp->command_chr == 'C' || scp->command_chr == 'D') {
            /*
             * Common handling of the start of this case, because the
             * messages are parsed similarly. We diverge later.
             */
            const char *q, *p = scp->command->s + 1; /* skip the 'C' */

            scp->attrs.flags = SSH_FILEXFER_ATTR_PERMISSIONS;
            scp->attrs.permissions = 0;
            while (*p >= '0' && *p <= '7') {
                scp->attrs.permissions =
                    scp->attrs.permissions * 8 + (*p - '0');
                p++;
            }
            if (*p != ' ')
                goto parse_error;
            p++;

            q = p;
            while (*p >= '0' && *p <= '9')
                p++;
            if (*p != ' ')
                goto parse_error;
            p++;
            scp->file_size = strtoull(q, NULL, 10);

            ptrlen leafname = make_ptrlen(
                p, scp->command->len - (p - scp->command->s));
            strbuf_clear(scp->filename_sb);
            put_datapl(scp->filename_sb, scp->head->destpath);
            if (scp->head->isdir) {
                if (scp->filename_sb->len > 0 &&
                    scp->filename_sb->s[scp->filename_sb->len-1]
                    != '/')
                    put_byte(scp->filename_sb, '/');
                put_datapl(scp->filename_sb, leafname);
            }
            scp->filename = ptrlen_from_strbuf(scp->filename_sb);

            if (scp->got_file_times) {
                scp->attrs.mtime = scp->mtime;
                scp->attrs.atime = scp->atime;
                scp->attrs.flags |= SSH_FILEXFER_ATTR_ACMODTIME;
            }
            scp->got_file_times = false;

            if (scp->command_chr == 'D') {
                sftpsrv_mkdir(scp->sf, &scp->reply.srb,
                              scp->filename, scp->attrs);

                if (scp->reply.err) {
                    scp->errmsg = dupprintf(
                        "'%.*s': unable to create directory: %s",
                        PTRLEN_PRINTF(scp->filename), scp->reply.errmsg);
                    goto done;
                }

                scp_sink_push(scp, scp->filename, true);
            } else {
                sftpsrv_open(scp->sf, &scp->reply.srb, scp->filename,
                             SSH_FXF_WRITE | SSH_FXF_CREAT | SSH_FXF_TRUNC,
                             scp->attrs);
                if (scp->reply.err) {
                    scp->errmsg = dupprintf(
                        "'%.*s': unable to open file: %s",
                        PTRLEN_PRINTF(scp->filename), scp->reply.errmsg);
                    goto done;
                }

                /*
                 * Now send an ack, and read the file data.
                 */
                sshfwd_write(scp->sc, "\0", 1);
                scp->file_offset = 0;
                while (scp->file_offset < scp->file_size) {
                    ptrlen data;
                    uint64_t this_len, remaining;

                    crMaybeWaitUntilV(
                        scp->input_eof || bufchain_size(&scp->data) > 0);
                    if (scp->input_eof) {
                        sftpsrv_close(scp->sf, &scp->reply.srb,
                                      scp->reply.handle);
                        goto done;
                    }

                    data = bufchain_prefix(&scp->data);
                    this_len = data.len;
                    remaining = scp->file_size - scp->file_offset;
                    if (this_len > remaining)
                        this_len = remaining;
                    sftpsrv_write(scp->sf, &scp->reply.srb,
                                  scp->reply.handle, scp->file_offset,
                                  make_ptrlen(data.ptr, this_len));
                    if (scp->reply.err) {
                        scp->errmsg = dupprintf(
                            "'%.*s': unable to write to file: %s",
                            PTRLEN_PRINTF(scp->filename), scp->reply.errmsg);
                        goto done;
                    }
                    bufchain_consume(&scp->data, this_len);
                    scp->file_offset += this_len;
                }

                /*
                 * Wait for the trailing NUL byte.
                 */
                crMaybeWaitUntilV(
                    scp->input_eof || bufchain_size(&scp->data) > 0);
                if (scp->input_eof) {
                    sftpsrv_close(scp->sf, &scp->reply.srb,
                                  scp->reply.handle);
                    goto done;
                }
                bufchain_consume(&scp->data, 1);
            }
        } else if (scp->command_chr == 'E') {
            if (!scp->head) {
                scp->errmsg = dupstr("received E command without matching D");
                goto done;
            }
            scp_sink_pop(scp);
            scp->got_file_times = false;
        } else {
            ptrlen cmd_pl;

            /*
             * Also come here if any of the above cases run into
             * parsing difficulties.
             */
          parse_error:
            cmd_pl = ptrlen_from_strbuf(scp->command);
            scp->errmsg = dupprintf("unrecognised scp command '%.*s'",
                                    PTRLEN_PRINTF(cmd_pl));
            goto done;
        }
    }

  done:
    if (scp->errmsg) {
        sshfwd_write_ext(scp->sc, true, scp->errmsg, strlen(scp->errmsg));
        sshfwd_write_ext(scp->sc, true, "\012", 1);
        sshfwd_send_exit_status(scp->sc, 1);
    } else {
        sshfwd_send_exit_status(scp->sc, 0);
    }
    sshfwd_write_eof(scp->sc);
    sshfwd_initiate_close(scp->sc, scp->errmsg);
    while (1) crReturnV;

    crFinishV;
}